

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O1

Amap_Lib_t * Amap_ParseTokens(Vec_Ptr_t *vTokens,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  Aig_MmFlex_t *pAVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Amap_Lib_t *p;
  Amap_Gat_t *pAVar8;
  void **ppvVar9;
  size_t sVar10;
  char *pcVar11;
  Amap_Gat_t *pAVar12;
  Amap_Lib_t *pAVar13;
  undefined4 uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  void *pvVar20;
  double dVar21;
  char *pcVar22;
  Amap_Lib_t *pAVar23;
  char *local_80;
  
  p = Amap_LibAlloc();
  if (0 < vTokens->nSize) {
    pcVar22 = (char *)*vTokens->pArray;
    uVar5 = 1;
    do {
      iVar4 = strcmp(pcVar22,"GATE");
      if (iVar4 != 0) {
        Amap_LibFree(p);
        pcVar11 = "The first line should begin with %s.\n";
        pcVar22 = "GATE";
LAB_003cb8c2:
        printf(pcVar11,pcVar22);
        return (Amap_Lib_t *)0x0;
      }
      iVar4 = Amap_ParseCountPins(vTokens,uVar5);
      pAVar8 = (Amap_Gat_t *)Aig_MmFlexEntryFetch(p->pMemGates,iVar4 * 0x48 + 0x40);
      pAVar8->pName = (char *)0x0;
      pAVar8->pOutName = (char *)0x0;
      pAVar8->pLib = (Amap_Lib_t *)0x0;
      pAVar8->pTwin = (Amap_Gat_t *)0x0;
      pAVar8->pFunc = (uint *)0x0;
      *(undefined8 *)&pAVar8->field_0x38 = 0;
      pAVar8->dArea = 0.0;
      pAVar8->pForm = (char *)0x0;
      *(uint *)&pAVar8->field_0x38 =
           *(uint *)&pAVar8->field_0x38 & 0xff800000 | p->vGates->nSize & 0x7fffffU;
      pVVar1 = p->vGates;
      uVar6 = pVVar1->nCap;
      if (pVVar1->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar9;
          iVar19 = 0x10;
        }
        else {
          iVar19 = uVar6 * 2;
          if (iVar19 <= (int)uVar6) goto LAB_003cb3b8;
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar1->pArray,(ulong)uVar6 << 4);
          }
          pVVar1->pArray = ppvVar9;
        }
        pVVar1->nCap = iVar19;
      }
LAB_003cb3b8:
      iVar19 = pVVar1->nSize;
      pVVar1->nSize = iVar19 + 1;
      pVVar1->pArray[iVar19] = pAVar8;
      pAVar8->pLib = p;
      pAVar8->field_0x3b = (char)iVar4;
      if (((int)uVar5 < 0) || (vTokens->nSize <= (int)uVar5)) break;
      pcVar22 = (char *)vTokens->pArray[uVar5];
      if (pcVar22 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pAVar2 = p->pMemGates;
        sVar10 = strlen(pcVar22);
        pcVar11 = Aig_MmFlexEntryFetch(pAVar2,(int)sVar10 + 1);
        strcpy(pcVar11,pcVar22);
      }
      pAVar8->pName = pcVar11;
      iVar4 = vTokens->nSize;
      if (iVar4 <= (int)(uVar5 + 1)) break;
      ppvVar9 = vTokens->pArray;
      dVar21 = atof((char *)ppvVar9[uVar5 + 1]);
      pAVar8->dArea = dVar21;
      if (iVar4 <= (int)(uVar5 + 2)) break;
      pcVar22 = (char *)ppvVar9[uVar5 + 2];
      if (pcVar22 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pAVar2 = p->pMemGates;
        sVar10 = strlen(pcVar22);
        pcVar11 = Aig_MmFlexEntryFetch(pAVar2,(int)sVar10 + 1);
        strcpy(pcVar11,pcVar22);
      }
      pAVar8->pOutName = pcVar11;
      if (vTokens->nSize <= (int)(uVar5 + 3)) break;
      pcVar22 = (char *)vTokens->pArray[uVar5 + 3];
      uVar5 = Amap_CollectFormulaTokens(vTokens,pcVar22,uVar5 + 4);
      uVar16 = (ulong)uVar5;
      if (pcVar22 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pAVar2 = p->pMemGates;
        sVar10 = strlen(pcVar22);
        pcVar11 = Aig_MmFlexEntryFetch(pAVar2,(int)sVar10 + 1);
        strcpy(pcVar11,pcVar22);
      }
      pAVar8->pForm = pcVar11;
      pAVar12 = pAVar8 + 1;
      if (*(uint *)&pAVar8->field_0x38 < 0x1000000) {
        uVar6 = *(uint *)&pAVar8->field_0x38 >> 0x18;
      }
      else {
        lVar17 = 0;
        lVar18 = 0;
        do {
          if ((int)uVar5 < 0) goto LAB_003cb9c8;
          iVar4 = vTokens->nSize;
          iVar19 = (int)lVar18;
          if (iVar4 <= (int)(uVar5 + iVar19)) goto LAB_003cb9c8;
          ppvVar9 = vTokens->pArray;
          iVar7 = strcmp((char *)ppvVar9[uVar16 + lVar18],"PIN");
          if (iVar7 != 0) {
            Amap_LibFree(p);
            pcVar22 = pAVar8->pName;
            pcVar11 = "Cannot parse gate %s.\n";
            goto LAB_003cb8c2;
          }
          if (iVar4 <= (int)(uVar5 + iVar19 + 1)) goto LAB_003cb9c8;
          pcVar22 = (char *)ppvVar9[uVar16 + lVar18 + 1];
          if (pcVar22 == (char *)0x0) {
            pAVar13 = (Amap_Lib_t *)0x0;
          }
          else {
            pAVar2 = p->pMemGates;
            sVar10 = strlen(pcVar22);
            pAVar13 = (Amap_Lib_t *)Aig_MmFlexEntryFetch(pAVar2,(int)sVar10 + 1);
            strcpy((char *)pAVar13,pcVar22);
          }
          (&pAVar12->pLib)[lVar18] = pAVar13;
          iVar4 = vTokens->nSize;
          if (iVar4 <= (int)(uVar5 + iVar19 + 2)) goto LAB_003cb9c8;
          ppvVar9 = vTokens->pArray;
          pcVar22 = (char *)ppvVar9[uVar16 + lVar18 + 2];
          iVar7 = strcmp(pcVar22,"UNKNOWN");
          if (iVar7 == 0) {
            uVar14 = 0;
          }
          else {
            iVar7 = strcmp(pcVar22,"INV");
            if (iVar7 == 0) {
              uVar14 = 1;
            }
            else {
              iVar7 = strcmp(pcVar22,"NONINV");
              uVar14 = 2;
              if (iVar7 != 0) {
                Amap_LibFree(p);
                printf("Cannot read phase of pin %s of gate %s\n",(&pAVar8[1].pLib)[lVar18],
                       pAVar8->pName);
                return (Amap_Lib_t *)0x0;
              }
            }
          }
          *(undefined4 *)(&pAVar8[1].pTwin + lVar18) = uVar14;
          if (iVar4 <= (int)(uVar5 + iVar19 + 3)) goto LAB_003cb9c8;
          pcVar22 = (char *)atof((char *)ppvVar9[uVar16 + lVar18 + 3]);
          (&pAVar8[1].pName)[lVar18] = pcVar22;
          if (iVar4 <= (int)(uVar5 + iVar19 + 4)) goto LAB_003cb9c8;
          pcVar22 = (char *)atof((char *)ppvVar9[uVar16 + lVar18 + 4]);
          (&pAVar8[1].pOutName)[lVar18] = pcVar22;
          if (iVar4 <= (int)(uVar5 + iVar19 + 5)) goto LAB_003cb9c8;
          pAVar13 = (Amap_Lib_t *)atof((char *)ppvVar9[uVar16 + lVar18 + 5]);
          (&pAVar8[1].dArea)[lVar18] = (double)pAVar13;
          if (iVar4 <= (int)(uVar5 + iVar19 + 6)) goto LAB_003cb9c8;
          pcVar22 = (char *)atof((char *)ppvVar9[uVar16 + lVar18 + 6]);
          (&pAVar8[1].pForm)[lVar18] = pcVar22;
          if (iVar4 <= (int)(uVar5 + iVar19 + 7)) goto LAB_003cb9c8;
          pAVar23 = (Amap_Lib_t *)atof((char *)ppvVar9[uVar16 + lVar18 + 7]);
          (&pAVar8[1].pFunc)[lVar18] = (uint *)pAVar23;
          if (iVar4 <= (int)(uVar5 + iVar19 + 8)) goto LAB_003cb9c8;
          dVar21 = atof((char *)ppvVar9[uVar16 + lVar18 + 8]);
          *(double *)(&pAVar8[1].field_0x38 + lVar18 * 8) = dVar21;
          if ((double)pAVar13 <= (double)pAVar23) {
            pAVar13 = pAVar23;
          }
          (&pAVar8[2].pLib)[lVar18] = pAVar13;
          uVar6 = (uint)(byte)pAVar8->field_0x3b;
          lVar18 = lVar18 + 9;
          uVar15 = (long)&pAVar12[1].pTwin + lVar17;
          lVar17 = lVar17 + 0x48;
        } while (uVar15 < (long)pAVar12 + (ulong)(byte)pAVar8->field_0x3b * 0x48);
        uVar16 = (ulong)(uVar5 + (int)lVar18);
      }
      if ((uVar6 == 1) && (iVar4 = strcmp((char *)pAVar12->pLib,"*"), iVar4 == 0)) {
        pAVar8 = Amap_ParseGateWithSamePins(pAVar8);
        pVVar1 = p->vGates;
        if (pVVar1->nSize < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
        }
        ppvVar9 = pVVar1->pArray;
        uVar6 = pVVar1->nSize - 1;
        pVVar1->nSize = uVar6;
        uVar5 = pVVar1->nCap;
        if (uVar6 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (ppvVar9 == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(ppvVar9,0x80);
            }
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar5 * 2;
            if (iVar4 <= (int)uVar5) goto LAB_003cb857;
            if (ppvVar9 == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(ppvVar9,(ulong)uVar5 << 4);
            }
          }
          pVVar1->pArray = ppvVar9;
          pVVar1->nCap = iVar4;
        }
LAB_003cb857:
        iVar4 = pVVar1->nSize;
        pVVar1->nSize = iVar4 + 1;
        pVVar1->pArray[iVar4] = pAVar8;
      }
      iVar4 = (int)uVar16;
      if ((iVar4 < 0) || (vTokens->nSize <= iVar4)) break;
      uVar5 = iVar4 + 1;
      pcVar22 = (char *)vTokens->pArray[uVar16];
      iVar4 = strcmp(pcVar22,".end");
      if (iVar4 == 0) {
        lVar17 = (long)p->vGates->nSize;
        if (lVar17 < 1) {
          local_80 = (char *)0x0;
          uVar5 = 0;
        }
        else {
          ppvVar9 = p->vGates->pArray;
          lVar18 = 0;
          uVar5 = 0;
          local_80 = (char *)0x0;
          pvVar20 = (void *)0x0;
          do {
            pvVar3 = ppvVar9[lVar18];
            if (pvVar20 != (void *)0x0) {
              pcVar22 = *(char **)((long)pvVar3 + 0x10);
              iVar4 = strcmp(*(char **)((long)pvVar20 + 0x10),pcVar22);
              if (iVar4 == 0) {
                *(void **)((long)pvVar20 + 8) = pvVar3;
                *(void **)((long)pvVar3 + 8) = pvVar20;
                if (local_80 == (char *)0x0) {
                  local_80 = pcVar22;
                }
                uVar5 = uVar5 + 1;
              }
            }
            lVar18 = lVar18 + 1;
            pvVar20 = pvVar3;
          } while (lVar17 != lVar18);
        }
        if (uVar5 != 0) {
          printf("Warning: Detected %d multi-output gates (for example, \"%s\").\n",(ulong)uVar5,
                 local_80);
        }
        return p;
      }
    } while( true );
  }
LAB_003cb9c8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Amap_Lib_t * Amap_ParseTokens( Vec_Ptr_t * vTokens, int fVerbose )
{
    Amap_Lib_t * p;
    Amap_Gat_t * pGate, * pPrev;
    Amap_Pin_t * pPin;
    char * pToken, * pMoGate = NULL;
    int i, nPins, iPos = 0, Count = 0;
    p = Amap_LibAlloc();
    pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
    do 
    {
        if ( strcmp( pToken, AMAP_STRING_GATE ) )
        {
            Amap_LibFree( p );
            printf( "The first line should begin with %s.\n", AMAP_STRING_GATE );
            return NULL;
        }
        // start gate
        nPins = Amap_ParseCountPins( vTokens, iPos );
        pGate = Amap_ParseGateAlloc( p->pMemGates, nPins );
        memset( pGate, 0, sizeof(Amap_Gat_t) );
        pGate->Id = Vec_PtrSize( p->vGates );
        Vec_PtrPush( p->vGates, pGate );
        pGate->pLib = p;
        pGate->nPins = nPins;
        // read gate
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pName = Amap_ParseStrsav( p->pMemGates, pToken );    
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->dArea = atof( pToken );
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pOutName = Amap_ParseStrsav( p->pMemGates, pToken ); 
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        iPos = Amap_CollectFormulaTokens( vTokens, pToken, iPos );
        pGate->pForm = Amap_ParseStrsav( p->pMemGates, pToken ); 
        // read pins
        Amap_GateForEachPin( pGate, pPin )
        {
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_PIN ) )
            {
                Amap_LibFree( p );
                printf( "Cannot parse gate %s.\n", pGate->pName );
                return NULL;
            }
            // read pin
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->pName = Amap_ParseStrsav( p->pMemGates, pToken );   
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_UNKNOWN ) == 0 )
                pPin->Phase = AMAP_PHASE_UNKNOWN;
            else if ( strcmp( pToken, AMAP_STRING_INV ) == 0 )
                pPin->Phase = AMAP_PHASE_INV;
            else if ( strcmp( pToken, AMAP_STRING_NONINV ) == 0 )
                pPin->Phase = AMAP_PHASE_NONINV;
            else 
            {
                Amap_LibFree( p );
                printf( "Cannot read phase of pin %s of gate %s\n", pPin->pName, pGate->pName );
                return NULL;
            }
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadInput = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadMax = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockFall = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutFall = atof( pToken );
            if ( pPin->dDelayBlockRise > pPin->dDelayBlockFall )
                pPin->dDelayBlockMax = pPin->dDelayBlockRise;
            else
                pPin->dDelayBlockMax = pPin->dDelayBlockFall;
        }
        // fix the situation when all pins are represented as one
        if ( pGate->nPins == 1 && !strcmp( pGate->Pins->pName, "*" ) )
        {
            pGate = Amap_ParseGateWithSamePins( pGate );
            Vec_PtrPop( p->vGates );
            Vec_PtrPush( p->vGates, pGate );
        }
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
//printf( "Finished reading gate %s (%s)\n", pGate->pName, pGate->pOutName );
    }
    while ( strcmp( pToken, ".end" ) );

    // check if there are gates with identical names
    pPrev = NULL;
    Amap_LibForEachGate( p, pGate, i )
    {
        if ( pPrev && !strcmp(pPrev->pName, pGate->pName) )
        {
            pPrev->pTwin = pGate, pGate->pTwin = pPrev;
//            printf( "Warning: Detected multi-output gate \"%s\".\n", pGate->pName );
            if ( pMoGate == NULL )
                pMoGate = pGate->pName;
            Count++;
        }
        pPrev = pGate;
    }
    if ( Count )
        printf( "Warning: Detected %d multi-output gates (for example, \"%s\").\n", Count, pMoGate );
    return p;
}